

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O3

QString * __thiscall
QTimeZonePrivate::displayName
          (QString *__return_storage_ptr__,QTimeZonePrivate *this,qint64 atMSecsSinceEpoch,
          NameType nameType,QLocale *locale)

{
  Data *pDVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  long in_FS_OFFSET;
  Data tran;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  int local_48;
  undefined4 uStack_44;
  int iStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = -0x55555556;
  uStack_44 = 0xaaaaaaaa;
  iStack_40 = -0x55555556;
  uStack_3c = 0xaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  local_68 = 0xaaaaaaaa;
  uStack_64 = 0xaaaaaaaa;
  uStack_60 = 0xaaaaaaaa;
  uStack_5c = 0xaaaaaaaa;
  (*this->_vptr_QTimeZonePrivate[0xd])(&local_68);
  if (nameType == ShortName) {
    iVar4 = (*this->_vptr_QTimeZonePrivate[0xf])(this,locale);
    if ((char)iVar4 != '\0') {
      pDVar1 = (Data *)CONCAT44(uStack_64,local_68);
      (__return_storage_ptr__->d).d = pDVar1;
      (__return_storage_ptr__->d).ptr = (char16_t *)CONCAT44(uStack_5c,uStack_60);
      (__return_storage_ptr__->d).size = CONCAT44(uStack_54,local_58);
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_003f3b1e;
    }
  }
  else if ((nameType == OffsetName) && (bVar3 = isAnglicLocale(locale), bVar3)) {
    isoOffsetFormat(__return_storage_ptr__,local_48,OffsetName);
    goto LAB_003f3b1e;
  }
  localeName(__return_storage_ptr__,this,atMSecsSinceEpoch,local_48,(uint)(iStack_40 != 0),nameType,
             locale);
LAB_003f3b1e:
  piVar2 = (int *)CONCAT44(uStack_64,local_68);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_64,local_68),2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QTimeZonePrivate::displayName(qint64 atMSecsSinceEpoch,
                                      QTimeZone::NameType nameType,
                                      const QLocale &locale) const
{
    const Data tran = data(atMSecsSinceEpoch);
    if (tran.atMSecsSinceEpoch != invalidMSecs()) {
        if (nameType == QTimeZone::OffsetName && isAnglicLocale(locale))
            return isoOffsetFormat(tran.offsetFromUtc);
        if (nameType == QTimeZone::ShortName && isDataLocale(locale))
            return tran.abbreviation;

        QTimeZone::TimeType timeType
            = tran.daylightTimeOffset != 0 ? QTimeZone::DaylightTime : QTimeZone::StandardTime;
#if QT_CONFIG(timezone_locale)
        return localeName(atMSecsSinceEpoch, tran.offsetFromUtc, timeType, nameType, locale);
#else
        return displayName(timeType, nameType, locale);
#endif
    }
    return QString();
}